

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnLocalDecl
          (BinaryReaderLogging *this,Index decl_index,Index count,Type type)

{
  Stream *this_00;
  Enum EVar1;
  char *pcVar2;
  Type type_local;
  Index count_local;
  Index decl_index_local;
  BinaryReaderLogging *this_local;
  
  WriteIndent(this);
  this_00 = this->stream_;
  pcVar2 = GetTypeName(type);
  Stream::Writef(this_00,"OnLocalDecl(index: %u, count: %u, type: %s)\n",(ulong)decl_index,
                 (ulong)count,pcVar2);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x34])
                    (this->reader_,(ulong)decl_index,(ulong)count,(ulong)(uint)type);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnLocalDecl(Index decl_index,
                                        Index count,
                                        Type type) {
  LOGF("OnLocalDecl(index: %" PRIindex ", count: %" PRIindex ", type: %s)\n",
       decl_index, count, GetTypeName(type));
  return reader_->OnLocalDecl(decl_index, count, type);
}